

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

QVariant * __thiscall
QGraphicsView::inputMethodQuery
          (QVariant *__return_storage_ptr__,QGraphicsView *this,InputMethodQuery query)

{
  QObject *pQVar1;
  bool bVar2;
  int iVar3;
  QPoint QVar4;
  undefined8 uVar5;
  QGraphicsViewPrivate *this_00;
  long in_FS_OFFSET;
  double in_XMM1_Qa;
  undefined1 auVar6 [16];
  QRect QVar7;
  QRectF local_b0;
  QRectF local_90;
  QRectF local_70;
  QVariant local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsViewPrivate **)(this + 8);
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)&this_00->scene);
  if (!bVar2) {
    (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
    *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
    goto LAB_005be501;
  }
  *(undefined1 **)((long)&(__return_storage_ptr__->d).data + 0x10) = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(__return_storage_ptr__->d).field_0x18 = &DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)((long)&(__return_storage_ptr__->d).data + 8) = &DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = (this_00->scene).wp.value;
  (**(code **)(*(long *)pQVar1 + 0x60))(__return_storage_ptr__,pQVar1,query);
  iVar3 = ::QVariant::typeId(__return_storage_ptr__);
  if (iVar3 == 0x14) {
    ::QVariant::toRectF();
    QGraphicsViewPrivate::mapRectFromScene(&local_70,this_00,&local_90);
    ::QVariant::QVariant(&local_50,(QRectF *)this_00);
  }
  else {
    iVar3 = ::QVariant::typeId(__return_storage_ptr__);
    if (iVar3 == 0x1a) {
      local_90.xp = (qreal)::QVariant::toPointF();
      local_90.yp = in_XMM1_Qa;
    }
    else {
      iVar3 = ::QVariant::typeId(__return_storage_ptr__);
      if (iVar3 == 0x13) {
        auVar6 = ::QVariant::toRect();
        local_b0.xp = (qreal)auVar6._0_4_;
        local_b0.yp = (qreal)auVar6._4_4_;
        local_b0.w = (qreal)(((long)auVar6._8_4_ - (long)auVar6._0_4_) + 1);
        local_b0.h = (qreal)(((auVar6._8_8_ >> 0x20) - (auVar6._0_8_ >> 0x20)) + 1);
        QGraphicsViewPrivate::mapRectFromScene(&local_90,this_00,&local_b0);
        QVar7 = QRectF::toRect(&local_90);
        ::QVariant::QVariant(&local_50,QVar7);
        goto LAB_005be4ee;
      }
      iVar3 = ::QVariant::typeId(__return_storage_ptr__);
      if (iVar3 != 0x19) goto LAB_005be501;
      uVar5 = ::QVariant::toPoint();
      local_90.xp = (qreal)(int)uVar5;
      local_90.yp = (qreal)(int)((ulong)uVar5 >> 0x20);
    }
    QVar4 = mapFromScene(this,(QPointF *)&local_90);
    ::QVariant::QVariant(&local_50,QVar4);
  }
LAB_005be4ee:
  ::QVariant::operator=(__return_storage_ptr__,&local_50);
  ::QVariant::~QVariant(&local_50);
LAB_005be501:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QGraphicsView::inputMethodQuery(Qt::InputMethodQuery query) const
{
    Q_D(const QGraphicsView);
    if (!d->scene)
        return QVariant();

    QVariant value = d->scene->inputMethodQuery(query);
    if (value.userType() == QMetaType::QRectF)
        value = d->mapRectFromScene(value.toRectF());
    else if (value.userType() == QMetaType::QPointF)
        value = mapFromScene(value.toPointF());
    else if (value.userType() == QMetaType::QRect)
        value = d->mapRectFromScene(value.toRect()).toRect();
    else if (value.userType() == QMetaType::QPoint)
        value = mapFromScene(value.toPoint());
    return value;
}